

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool cJSON_Compare(cJSON *a,cJSON *b,cJSON_bool case_sensitive)

{
  uint uVar1;
  uint uVar2;
  cJSON_bool cVar3;
  int iVar4;
  cJSON *pcVar5;
  uint uVar6;
  uint uVar8;
  cJSON *pcVar9;
  bool bVar10;
  uint uVar7;
  
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = uVar6;
  if ((b != (cJSON *)0x0 && a != (cJSON *)0x0) && ((char)b->type == (char)a->type)) {
    uVar2 = a->type & 0xff;
    uVar1 = uVar2 - 1;
    uVar8 = uVar7;
    if (((uVar1 < 0x40) && ((0x800000008000808bU >> ((ulong)uVar1 & 0x3f) & 1) != 0)) ||
       (uVar2 == 0x80)) {
      if (((a == b) || (uVar1 < 2)) || (uVar2 == 4)) {
LAB_001051af:
        uVar8 = 1;
      }
      else if ((uVar2 == 0x80) || (uVar2 == 0x10)) {
        if ((a->valuestring != (char *)0x0) && (b->valuestring != (char *)0x0)) {
          iVar4 = strcmp(a->valuestring,b->valuestring);
          bVar10 = iVar4 == 0;
LAB_00105178:
          uVar8 = (uint)bVar10;
        }
      }
      else if (uVar2 == 0x20) {
        pcVar5 = (cJSON *)&a->child;
        pcVar9 = (cJSON *)&b->child;
        do {
          pcVar9 = pcVar9->next;
          pcVar5 = pcVar5->next;
          if ((pcVar5 == (cJSON *)0x0) || (pcVar9 == (cJSON *)0x0)) {
            bVar10 = pcVar5 == pcVar9;
            goto LAB_00105178;
          }
          cVar3 = cJSON_Compare(pcVar5,pcVar9,case_sensitive);
        } while (cVar3 != 0);
      }
      else if (uVar2 == 0x40) {
        pcVar9 = (cJSON *)&a->child;
        do {
          pcVar9 = pcVar9->next;
          if (pcVar9 == (cJSON *)0x0) {
            pcVar9 = (cJSON *)&b->child;
            while (pcVar9 = pcVar9->next, pcVar9 != (cJSON *)0x0) {
              pcVar5 = get_object_item(a,pcVar9->string,case_sensitive);
              if (pcVar5 == (cJSON *)0x0) {
                return 0;
              }
              cVar3 = cJSON_Compare(pcVar9,pcVar5,case_sensitive);
              if (cVar3 == 0) {
                return 0;
              }
            }
            goto LAB_001051af;
          }
          pcVar5 = get_object_item(b,pcVar9->string,case_sensitive);
        } while ((pcVar5 != (cJSON *)0x0) &&
                (cVar3 = cJSON_Compare(pcVar9,pcVar5,case_sensitive), cVar3 != 0));
      }
      else {
        uVar8 = uVar6;
        if (uVar2 == 8) {
          cVar3 = compare_double(a->valuedouble,b->valuedouble);
          return cVar3;
        }
      }
    }
  }
  return uVar8;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_Compare(const cJSON * const a, const cJSON * const b, const cJSON_bool case_sensitive)
{
    if ((a == NULL) || (b == NULL) || ((a->type & 0xFF) != (b->type & 0xFF)))
    {
        return false;
    }

    /* check if type is valid */
    switch (a->type & 0xFF)
    {
        case cJSON_False:
        case cJSON_True:
        case cJSON_NULL:
        case cJSON_Number:
        case cJSON_String:
        case cJSON_Raw:
        case cJSON_Array:
        case cJSON_Object:
            break;

        default:
            return false;
    }

    /* identical objects are equal */
    if (a == b)
    {
        return true;
    }

    switch (a->type & 0xFF)
    {
        /* in these cases and equal type is enough */
        case cJSON_False:
        case cJSON_True:
        case cJSON_NULL:
            return true;

        case cJSON_Number:
            if (compare_double(a->valuedouble, b->valuedouble))
            {
                return true;
            }
            return false;

        case cJSON_String:
        case cJSON_Raw:
            if ((a->valuestring == NULL) || (b->valuestring == NULL))
            {
                return false;
            }
            if (strcmp(a->valuestring, b->valuestring) == 0)
            {
                return true;
            }

            return false;

        case cJSON_Array:
        {
            cJSON *a_element = a->child;
            cJSON *b_element = b->child;

            for (; (a_element != NULL) && (b_element != NULL);)
            {
                if (!cJSON_Compare(a_element, b_element, case_sensitive))
                {
                    return false;
                }

                a_element = a_element->next;
                b_element = b_element->next;
            }

            /* one of the arrays is longer than the other */
            if (a_element != b_element) {
                return false;
            }

            return true;
        }

        case cJSON_Object:
        {
            cJSON *a_element = NULL;
            cJSON *b_element = NULL;
            cJSON_ArrayForEach(a_element, a)
            {
                /* TODO This has O(n^2) runtime, which is horrible! */
                b_element = get_object_item(b, a_element->string, case_sensitive);
                if (b_element == NULL)
                {
                    return false;
                }

                if (!cJSON_Compare(a_element, b_element, case_sensitive))
                {
                    return false;
                }
            }

            /* doing this twice, once on a and b to prevent true comparison if a subset of b
             * TODO: Do this the proper way, this is just a fix for now */
            cJSON_ArrayForEach(b_element, b)
            {
                a_element = get_object_item(a, b_element->string, case_sensitive);
                if (a_element == NULL)
                {
                    return false;
                }

                if (!cJSON_Compare(b_element, a_element, case_sensitive))
                {
                    return false;
                }
            }

            return true;
        }

        default:
            return false;
    }
}